

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O1

void __thiscall
cmake::SetArgs(cmake *this,
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *args)

{
  size_type sVar1;
  size_type sVar2;
  bool bVar3;
  int iVar4;
  LogLevel LVar5;
  pointer pbVar6;
  long lVar7;
  cmGlobalGenerator *gg;
  undefined8 uVar8;
  string *psVar9;
  undefined1 extraout_DL;
  undefined1 extraout_DL_00;
  undefined1 extraout_DL_01;
  undefined1 extraout_DL_02;
  undefined1 extraout_DL_03;
  undefined1 extraout_DL_04;
  undefined1 collapse;
  string *psVar10;
  uint uVar11;
  ulong uVar12;
  string kdevError;
  string value;
  undefined1 local_108 [40];
  string local_e0;
  ulong local_c0;
  ulong local_b8;
  string *local_b0;
  string *local_a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_a0;
  string *local_98;
  string *local_90;
  string *local_88;
  string *local_80;
  string *local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pbVar6 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (0x20 < (ulong)((long)(args->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar6)) {
    local_b0 = (string *)&this->GeneratorToolset;
    local_a8 = (string *)&this->GeneratorPlatform;
    local_a0 = &this->TraceOnlyThisSources;
    local_98 = (string *)&this->GraphVizFile;
    local_90 = (string *)&this->CheckStampList;
    local_88 = (string *)&this->CheckStampFile;
    local_80 = (string *)&this->CheckBuildSystemArgument;
    local_78 = &this->GeneratorInstance;
    uVar12 = 1;
    local_c0 = 0;
    local_b8 = 0;
    do {
      psVar9 = pbVar6 + uVar12;
      lVar7 = std::__cxx11::string::find((char *)psVar9,0x515f95,0);
      uVar11 = (uint)uVar12;
      if ((lVar7 == 0) ||
         (lVar7 = std::__cxx11::string::find((char *)psVar9,0x5244f1,0), lVar7 == 0)) {
        std::__cxx11::string::substr((ulong)&local_e0,(ulong)psVar9);
        if (local_e0._M_string_length != 0) {
LAB_001dca80:
          cmsys::SystemTools::CollapseFullPath((string *)local_108,&local_e0);
          std::__cxx11::string::operator=((string *)&local_e0,(string *)local_108);
          if ((element_type *)local_108._0_8_ != (element_type *)(local_108 + 0x10)) {
            operator_delete((void *)local_108._0_8_,CONCAT71(local_108._17_7_,local_108[0x10]) + 1);
          }
          cmsys::SystemTools::ConvertToUnixSlashes(&local_e0);
          bVar3 = true;
          SetHomeDirectory(this,&local_e0);
          goto LAB_001dcbe7;
        }
        uVar11 = uVar11 + 1;
        if ((ulong)uVar11 <
            (ulong)((long)(args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish -
                    (long)(args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start >> 5)) {
          std::__cxx11::string::_M_assign((string *)&local_e0);
          if (*local_e0._M_dataplus._M_p != '-') goto LAB_001dca80;
          local_108._0_8_ = local_108 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_108,"No source directory specified for -S","");
          cmSystemTools::Error((string *)local_108);
        }
        else {
          local_108._0_8_ = local_108 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_108,"No source directory specified for -S","");
          cmSystemTools::Error((string *)local_108);
        }
LAB_001dcb5b:
        if ((element_type *)local_108._0_8_ != (element_type *)(local_108 + 0x10)) {
          operator_delete((void *)local_108._0_8_,CONCAT71(local_108._17_7_,local_108[0x10]) + 1);
        }
LAB_001dcb76:
        bVar3 = false;
LAB_001dcbe7:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_dataplus._M_p !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)((long)&local_e0 + 0x10U)) {
          operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
        }
        if (bVar3) goto LAB_001dcc0c;
LAB_001dcfe3:
        bVar3 = false;
      }
      else {
        lVar7 = std::__cxx11::string::find((char *)psVar9,0x5244f4,0);
        if (lVar7 == 0) goto LAB_001dcc0c;
        lVar7 = std::__cxx11::string::find((char *)psVar9,0x524518,0);
        if (lVar7 == 0) {
          std::__cxx11::string::substr((ulong)&local_e0,(ulong)psVar9);
          if (local_e0._M_string_length != 0) {
LAB_001dcb9d:
            cmsys::SystemTools::CollapseFullPath((string *)local_108,&local_e0);
            std::__cxx11::string::operator=((string *)&local_e0,(string *)local_108);
            if ((element_type *)local_108._0_8_ != (element_type *)(local_108 + 0x10)) {
              operator_delete((void *)local_108._0_8_,CONCAT71(local_108._17_7_,local_108[0x10]) + 1
                             );
            }
            cmsys::SystemTools::ConvertToUnixSlashes(&local_e0);
            bVar3 = true;
            SetHomeOutputDirectory(this,&local_e0);
            goto LAB_001dcbe7;
          }
          uVar11 = uVar11 + 1;
          if ((ulong)uVar11 <
              (ulong)((long)(args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start >> 5)) {
            std::__cxx11::string::_M_assign((string *)&local_e0);
            if (*local_e0._M_dataplus._M_p != '-') goto LAB_001dcb9d;
            local_108._0_8_ = local_108 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_108,"No build directory specified for -B","");
            cmSystemTools::Error((string *)local_108);
          }
          else {
            local_108._0_8_ = local_108 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_108,"No build directory specified for -B","");
            cmSystemTools::Error((string *)local_108);
          }
          goto LAB_001dcb5b;
        }
        if ((uVar12 < ((long)(args->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish -
                       (long)(args->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start >> 5) - 2U) &&
           (lVar7 = std::__cxx11::string::find((char *)psVar9,0x52451b,0), lVar7 == 0)) {
          std::__cxx11::string::_M_assign(local_80);
          uVar11 = uVar11 + 2;
          iVar4 = atoi((args->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start[uVar11]._M_dataplus._M_p);
          this->ClearBuildSystem = 0 < iVar4;
        }
        else if (((uVar12 < ((long)(args->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_finish -
                             (long)(args->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start >> 5) - 1U) &&
                 (lVar7 = std::__cxx11::string::find((char *)psVar9,0x524530,0), psVar10 = local_88,
                 lVar7 == 0)) ||
                ((uVar12 < ((long)(args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_finish -
                            (long)(args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start >> 5) - 1U &&
                 (lVar7 = std::__cxx11::string::find((char *)psVar9,0x524543,0), psVar10 = local_90,
                 lVar7 == 0)))) {
          uVar11 = uVar11 + 1;
          std::__cxx11::string::_M_assign(psVar10);
        }
        else {
          lVar7 = std::__cxx11::string::find((char *)psVar9,0x53451e,0);
          if (((lVar7 == 0) ||
              (lVar7 = std::__cxx11::string::find((char *)psVar9,0x52437d,0), lVar7 == 0)) ||
             (lVar7 = std::__cxx11::string::find((char *)psVar9,0x52439e,0), lVar7 == 0)) {
            uVar11 = uVar11 + (psVar9->_M_string_length == 2);
          }
          else {
            lVar7 = std::__cxx11::string::find((char *)psVar9,0x513217,0);
            if ((lVar7 == 0) ||
               (lVar7 = std::__cxx11::string::find((char *)psVar9,0x51321a,0), lVar7 == 0)) {
              uVar11 = uVar11 + 1;
            }
            else {
              lVar7 = std::__cxx11::string::find((char *)psVar9,0x52432f,0);
              if (lVar7 != 0) {
                lVar7 = std::__cxx11::string::find((char *)psVar9,0x524556,0);
                if (lVar7 == 0) {
                  std::__cxx11::string::substr((ulong)&local_e0,(ulong)psVar9);
                  cmsys::SystemTools::CollapseFullPath((string *)local_108,&local_e0);
                  std::__cxx11::string::operator=((string *)&local_e0,(string *)local_108);
                  if ((element_type *)local_108._0_8_ != (element_type *)(local_108 + 0x10)) {
                    operator_delete((void *)local_108._0_8_,
                                    CONCAT71(local_108._17_7_,local_108[0x10]) + 1);
                  }
                  cmsys::SystemTools::ConvertToUnixSlashes(&local_e0);
                  std::__cxx11::string::_M_assign(local_98);
                  if ((this->GraphVizFile)._M_string_length != 0) {
LAB_001dce19:
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_e0._M_dataplus._M_p !=
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)((long)&local_e0 + 0x10U)) {
                      operator_delete(local_e0._M_dataplus._M_p,
                                      local_e0.field_2._M_allocated_capacity + 1);
                    }
                    goto LAB_001dcc0c;
                  }
                  local_108._0_8_ = local_108 + 0x10;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_108,"No file specified for --graphviz","");
                  cmSystemTools::Error((string *)local_108);
                  if ((element_type *)local_108._0_8_ != (element_type *)(local_108 + 0x10)) {
                    operator_delete((void *)local_108._0_8_,
                                    CONCAT71(local_108._17_7_,local_108[0x10]) + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_e0._M_dataplus._M_p !=
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)((long)&local_e0 + 0x10U)) {
                    operator_delete(local_e0._M_dataplus._M_p,
                                    local_e0.field_2._M_allocated_capacity + 1);
                  }
                  goto LAB_001dcfe3;
                }
                lVar7 = std::__cxx11::string::find((char *)psVar9,0x5139b8,0);
                if (lVar7 == 0) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,"debug trycompile on\n",0x14);
                  this->DebugTryCompile = true;
                }
                else {
                  lVar7 = std::__cxx11::string::find((char *)psVar9,0x513a1f,0);
                  if (lVar7 == 0) {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,"Running with debug output on.\n",0x1e);
                    this->DebugOutput = true;
                  }
                  else {
                    lVar7 = std::__cxx11::string::find((char *)psVar9,0x5245b7,0);
                    if (lVar7 == 0) {
                      std::__cxx11::string::substr((ulong)&local_e0,(ulong)psVar9);
                      LVar5 = StringToLogLevel(&local_e0);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_e0._M_dataplus._M_p !=
                          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)((long)&local_e0 + 0x10U)) {
                        operator_delete(local_e0._M_dataplus._M_p,
                                        local_e0.field_2._M_allocated_capacity + 1);
                      }
                      if (LVar5 == LOG_UNDEFINED) {
                        local_e0._M_dataplus._M_p = (pointer)((long)&local_e0 + 0x10);
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)&local_e0,"Invalid level specified for --loglevel","");
                        cmSystemTools::Error(&local_e0);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_e0._M_dataplus._M_p !=
                            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)((long)&local_e0 + 0x10U)) {
                          operator_delete(local_e0._M_dataplus._M_p,
                                          local_e0.field_2._M_allocated_capacity + 1);
                        }
                      }
                      else {
                        this->MessageLogLevel = LVar5;
                      }
                      if (LVar5 == LOG_UNDEFINED) goto LAB_001dcfe3;
                    }
                    else {
                      lVar7 = std::__cxx11::string::find((char *)psVar9,0x513a6a,0);
                      if (lVar7 == 0) {
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cout,"Running with expanded trace output on.\n",
                                   0x27);
                        this->Trace = true;
                        this->TraceExpand = true;
                      }
                      else {
                        lVar7 = std::__cxx11::string::find((char *)psVar9,0x524612,0);
                        if (lVar7 == 0) {
                          std::__cxx11::string::substr((ulong)&local_e0,(ulong)psVar9);
                          cmsys::SystemTools::ConvertToUnixSlashes(&local_e0);
                          std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::push_back(local_a0,&local_e0);
                          this->Trace = true;
                          goto LAB_001dce19;
                        }
                        lVar7 = std::__cxx11::string::find((char *)psVar9,0x513a49,0);
                        if (lVar7 == 0) {
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cout,"Running with trace output on.\n",0x1e);
                          this->Trace = true;
                          this->TraceExpand = false;
                        }
                        else {
                          lVar7 = std::__cxx11::string::find((char *)psVar9,0x513afd,0);
                          if (lVar7 == 0) {
                            std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)&std::cout,"Warn about uninitialized values.\n",
                                       0x21);
                            this->WarnUninitialized = true;
                          }
                          else {
                            lVar7 = std::__cxx11::string::find((char *)psVar9,0x513b33,0);
                            if (lVar7 == 0) {
                              std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)&std::cout,"Finding unused variables.\n",0x1a);
                              this->WarnUnused = true;
                            }
                            else {
                              lVar7 = std::__cxx11::string::find((char *)psVar9,0x513b63,0);
                              if (lVar7 == 0) {
                                std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)&std::cout,
                                           "Not searching for unused variables given on the ",0x30);
                                std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)&std::cout,"command line.\n",0xe);
                                this->WarnUnusedCli = false;
                              }
                              else {
                                lVar7 = std::__cxx11::string::find((char *)psVar9,0x513b9f,0);
                                if (lVar7 != 0) {
                                  lVar7 = std::__cxx11::string::find((char *)psVar9,0x524729,0);
                                  if (lVar7 == 0) {
                                    std::__cxx11::string::substr((ulong)&local_e0,(ulong)psVar9);
                                    if (local_e0._M_string_length == 0) {
                                      uVar11 = uVar11 + 1;
                                      if ((ulong)((long)(args->
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)(args->
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start >> 5)
                                          <= (ulong)uVar11) {
                                        local_108._0_8_ = local_108 + 0x10;
                                        std::__cxx11::string::_M_construct<char_const*>
                                                  ((string *)local_108,
                                                   "No platform specified for -A","");
                                        cmSystemTools::Error((string *)local_108);
                                        goto LAB_001dcb5b;
                                      }
                                      std::__cxx11::string::_M_assign((string *)&local_e0);
                                    }
                                    if ((local_b8 & 1) != 0) {
                                      local_108._0_8_ = local_108 + 0x10;
                                      std::__cxx11::string::_M_construct<char_const*>
                                                ((string *)local_108,
                                                 "Multiple -A options not allowed","");
                                      cmSystemTools::Error((string *)local_108);
                                      goto LAB_001dcb5b;
                                    }
                                    uVar8 = std::__cxx11::string::_M_assign(local_a8);
                                    this->GeneratorPlatformSet = true;
                                    bVar3 = true;
                                    local_b8 = CONCAT71((int7)((ulong)uVar8 >> 8),1);
                                  }
                                  else {
                                    lVar7 = std::__cxx11::string::find((char *)psVar9,0x524765,0);
                                    if (lVar7 == 0) {
                                      std::__cxx11::string::substr((ulong)&local_e0,(ulong)psVar9);
                                      if (local_e0._M_string_length == 0) {
                                        uVar11 = uVar11 + 1;
                                        if ((ulong)((long)(args->
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)(args->
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start >> 5)
                                            <= (ulong)uVar11) {
                                          local_108._0_8_ = local_108 + 0x10;
                                          std::__cxx11::string::_M_construct<char_const*>
                                                    ((string *)local_108,
                                                     "No toolset specified for -T","");
                                          cmSystemTools::Error((string *)local_108);
                                          goto LAB_001dcb5b;
                                        }
                                        std::__cxx11::string::_M_assign((string *)&local_e0);
                                      }
                                      if ((local_c0 & 1) != 0) {
                                        local_108._0_8_ = local_108 + 0x10;
                                        std::__cxx11::string::_M_construct<char_const*>
                                                  ((string *)local_108,
                                                   "Multiple -T options not allowed","");
                                        cmSystemTools::Error((string *)local_108);
                                        goto LAB_001dcb5b;
                                      }
                                      uVar8 = std::__cxx11::string::_M_assign(local_b0);
                                      this->GeneratorToolsetSet = true;
                                      bVar3 = true;
                                      local_c0 = CONCAT71((int7)((ulong)uVar8 >> 8),1);
                                    }
                                    else {
                                      lVar7 = std::__cxx11::string::find((char *)psVar9,0x5247a3,0);
                                      if (lVar7 != 0) {
                                        SetDirectoriesFromFile(this,psVar9);
                                        goto LAB_001dcc0c;
                                      }
                                      std::__cxx11::string::substr((ulong)&local_e0,(ulong)psVar9);
                                      if (local_e0._M_string_length == 0) {
                                        uVar11 = uVar11 + 1;
                                        if ((ulong)uVar11 <
                                            (ulong)((long)(args->
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)(args->
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start >> 5))
                                        {
                                          std::__cxx11::string::_M_assign((string *)&local_e0);
                                          goto LAB_001dd266;
                                        }
                                        local_108._0_8_ = local_108 + 0x10;
                                        std::__cxx11::string::_M_construct<char_const*>
                                                  ((string *)local_108,
                                                   "No generator specified for -G","");
                                        cmSystemTools::Error((string *)local_108);
                                        if ((element_type *)local_108._0_8_ !=
                                            (element_type *)(local_108 + 0x10)) {
                                          operator_delete((void *)local_108._0_8_,
                                                          CONCAT71(local_108._17_7_,local_108[0x10])
                                                          + 1);
                                        }
                                        PrintGeneratorList(this);
                                        goto LAB_001dcb76;
                                      }
LAB_001dd266:
                                      gg = CreateGlobalGenerator(this,&local_e0);
                                      if (gg == (cmGlobalGenerator *)0x0) {
                                        local_108._0_8_ = local_108 + 0x10;
                                        local_108._8_8_ =
                                             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                                        local_108[0x10] = '\0';
                                        lVar7 = std::__cxx11::string::find
                                                          ((char *)&local_e0,0x5247a6,0);
                                        if (lVar7 != -1) {
                                          std::__cxx11::string::operator=
                                                    ((string *)local_108,
                                                                                                          
                                                  "\nThe KDevelop3 generator is not supported anymore."
                                                  );
                                        }
                                        std::operator+(&local_70,"Could not create named generator "
                                                       ,&local_e0);
                                        std::operator+(&local_50,&local_70,
                                                       (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_108);
                                        cmSystemTools::Error(&local_50);
                                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                             *)local_50._M_dataplus._M_p != &local_50.field_2) {
                                          operator_delete(local_50._M_dataplus._M_p,
                                                          local_50.field_2._M_allocated_capacity + 1
                                                         );
                                        }
                                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                             *)local_70._M_dataplus._M_p != &local_70.field_2) {
                                          operator_delete(local_70._M_dataplus._M_p,
                                                          local_70.field_2._M_allocated_capacity + 1
                                                         );
                                        }
                                        PrintGeneratorList(this);
                                        goto LAB_001dcb5b;
                                      }
                                      bVar3 = true;
                                      SetGlobalGenerator(this,gg);
                                    }
                                  }
                                  goto LAB_001dcbe7;
                                }
                                std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)&std::cout,
                                           "Also check system files when warning about unused and ",
                                           0x36);
                                std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)&std::cout,"uninitialized variables.\n",0x19);
                                this->CheckSystemVars = true;
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
LAB_001dcc0c:
        bVar3 = true;
        if (this->GlobalGenerator != (cmGlobalGenerator *)0x0) {
          std::__cxx11::string::_M_replace
                    ((ulong)local_78,0,(char *)(this->GeneratorInstance)._M_string_length,0x556cf2);
          if (this->GeneratorPlatformSet == false) {
            std::__cxx11::string::_M_replace
                      ((ulong)local_a8,0,(char *)(this->GeneratorPlatform)._M_string_length,0x556cf2
                      );
          }
          if (this->GeneratorToolsetSet == false) {
            std::__cxx11::string::_M_replace
                      ((ulong)local_b0,0,(char *)(this->GeneratorToolset)._M_string_length,0x556cf2)
            ;
          }
        }
      }
      if (!bVar3) {
        return;
      }
      uVar12 = (ulong)(uVar11 + 1);
      pbVar6 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
    } while (uVar12 < (ulong)((long)(args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar6 >> 5)
            );
  }
  psVar9 = cmState::GetSourceDirectory_abi_cxx11_
                     ((this->State)._M_t.
                      super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                      super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                      super__Head_base<0UL,_cmState_*,_false>._M_head_impl);
  sVar1 = psVar9->_M_string_length;
  psVar9 = cmState::GetBinaryDirectory_abi_cxx11_
                     ((this->State)._M_t.
                      super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                      super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                      super__Head_base<0UL,_cmState_*,_false>._M_head_impl);
  sVar2 = psVar9->_M_string_length;
  collapse = extraout_DL;
  if ((this->CurrentWorkingMode == NORMAL_MODE) && (sVar2 == 0 && sVar1 == 0)) {
    local_e0._M_dataplus._M_p = (pointer)((long)&local_e0 + 0x10U);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_e0,
               "No source or binary directory provided. Both will be assumed to be the same as the current working directory, but note that this warning will become a fatal error in future CMake releases."
               ,"");
    local_108._0_8_ = (element_type *)0x0;
    local_108._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    cmMessenger::IssueMessage
              ((this->Messenger)._M_t.
               super___uniq_ptr_impl<cmMessenger,_std::default_delete<cmMessenger>_>._M_t.
               super__Tuple_impl<0UL,_cmMessenger_*,_std::default_delete<cmMessenger>_>.
               super__Head_base<0UL,_cmMessenger_*,_false>._M_head_impl,WARNING,&local_e0,
               (cmListFileBacktrace *)local_108);
    collapse = extraout_DL_00;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._8_8_);
      collapse = extraout_DL_01;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)((long)&local_e0 + 0x10U)) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
      collapse = extraout_DL_02;
    }
  }
  if (sVar1 == 0) {
    cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_
              (&local_e0,(SystemTools *)0x1,(bool)collapse);
    SetHomeDirectory(this,&local_e0);
    collapse = extraout_DL_03;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)((long)&local_e0 + 0x10U)) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
      collapse = extraout_DL_04;
    }
  }
  if (sVar2 == 0) {
    cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_
              (&local_e0,(SystemTools *)0x1,(bool)collapse);
    SetHomeOutputDirectory(this,&local_e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)((long)&local_e0 + 0x10U)) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void cmake::SetArgs(const std::vector<std::string>& args)
{
  bool haveToolset = false;
  bool havePlatform = false;
  for (unsigned int i = 1; i < args.size(); ++i) {
    std::string const& arg = args[i];
    if (arg.find("-H", 0) == 0 || arg.find("-S", 0) == 0) {
      std::string path = arg.substr(2);
      if (path.empty()) {
        ++i;
        if (i >= args.size()) {
          cmSystemTools::Error("No source directory specified for -S");
          return;
        }
        path = args[i];
        if (path[0] == '-') {
          cmSystemTools::Error("No source directory specified for -S");
          return;
        }
      }

      path = cmSystemTools::CollapseFullPath(path);
      cmSystemTools::ConvertToUnixSlashes(path);
      this->SetHomeDirectory(path);
    } else if (arg.find("-O", 0) == 0) {
      // There is no local generate anymore.  Ignore -O option.
    } else if (arg.find("-B", 0) == 0) {
      std::string path = arg.substr(2);
      if (path.empty()) {
        ++i;
        if (i >= args.size()) {
          cmSystemTools::Error("No build directory specified for -B");
          return;
        }
        path = args[i];
        if (path[0] == '-') {
          cmSystemTools::Error("No build directory specified for -B");
          return;
        }
      }

      path = cmSystemTools::CollapseFullPath(path);
      cmSystemTools::ConvertToUnixSlashes(path);
      this->SetHomeOutputDirectory(path);
    } else if ((i < args.size() - 2) &&
               (arg.find("--check-build-system", 0) == 0)) {
      this->CheckBuildSystemArgument = args[++i];
      this->ClearBuildSystem = (atoi(args[++i].c_str()) > 0);
    } else if ((i < args.size() - 1) &&
               (arg.find("--check-stamp-file", 0) == 0)) {
      this->CheckStampFile = args[++i];
    } else if ((i < args.size() - 1) &&
               (arg.find("--check-stamp-list", 0) == 0)) {
      this->CheckStampList = args[++i];
    }
#if defined(CMAKE_HAVE_VS_GENERATORS)
    else if ((i < args.size() - 1) &&
             (arg.find("--vs-solution-file", 0) == 0)) {
      this->VSSolutionFile = args[++i];
    }
#endif
    else if (arg.find("-D", 0) == 0) {
      // skip for now
      // in case '-D var=val' is given, also skip the next
      // in case '-Dvar=val' is given, don't skip the next
      if (arg.size() == 2) {
        ++i;
      }
    } else if (arg.find("-U", 0) == 0) {
      // skip for now
      // in case '-U var' is given, also skip the next
      // in case '-Uvar' is given, don't skip the next
      if (arg.size() == 2) {
        ++i;
      }
    } else if (arg.find("-C", 0) == 0) {
      // skip for now
      // in case '-C path' is given, also skip the next
      // in case '-Cpath' is given, don't skip the next
      if (arg.size() == 2) {
        ++i;
      }
    } else if (arg.find("-P", 0) == 0) {
      // skip for now
      i++;
    } else if (arg.find("--find-package", 0) == 0) {
      // skip for now
      i++;
    } else if (arg.find("-W", 0) == 0) {
      // skip for now
    } else if (arg.find("--graphviz=", 0) == 0) {
      std::string path = arg.substr(strlen("--graphviz="));
      path = cmSystemTools::CollapseFullPath(path);
      cmSystemTools::ConvertToUnixSlashes(path);
      this->GraphVizFile = path;
      if (this->GraphVizFile.empty()) {
        cmSystemTools::Error("No file specified for --graphviz");
        return;
      }
    } else if (arg.find("--debug-trycompile", 0) == 0) {
      std::cout << "debug trycompile on\n";
      this->DebugTryCompileOn();
    } else if (arg.find("--debug-output", 0) == 0) {
      std::cout << "Running with debug output on.\n";
      this->SetDebugOutputOn(true);
    } else if (arg.find("--loglevel=", 0) == 0) {
      const auto logLevel =
        StringToLogLevel(arg.substr(sizeof("--loglevel=") - 1));
      if (logLevel == LogLevel::LOG_UNDEFINED) {
        cmSystemTools::Error("Invalid level specified for --loglevel");
        return;
      }
      this->SetLogLevel(logLevel);
    } else if (arg.find("--trace-expand", 0) == 0) {
      std::cout << "Running with expanded trace output on.\n";
      this->SetTrace(true);
      this->SetTraceExpand(true);
    } else if (arg.find("--trace-source=", 0) == 0) {
      std::string file = arg.substr(strlen("--trace-source="));
      cmSystemTools::ConvertToUnixSlashes(file);
      this->AddTraceSource(file);
      this->SetTrace(true);
    } else if (arg.find("--trace", 0) == 0) {
      std::cout << "Running with trace output on.\n";
      this->SetTrace(true);
      this->SetTraceExpand(false);
    } else if (arg.find("--warn-uninitialized", 0) == 0) {
      std::cout << "Warn about uninitialized values.\n";
      this->SetWarnUninitialized(true);
    } else if (arg.find("--warn-unused-vars", 0) == 0) {
      std::cout << "Finding unused variables.\n";
      this->SetWarnUnused(true);
    } else if (arg.find("--no-warn-unused-cli", 0) == 0) {
      std::cout << "Not searching for unused variables given on the "
                << "command line.\n";
      this->SetWarnUnusedCli(false);
    } else if (arg.find("--check-system-vars", 0) == 0) {
      std::cout << "Also check system files when warning about unused and "
                << "uninitialized variables.\n";
      this->SetCheckSystemVars(true);
    } else if (arg.find("-A", 0) == 0) {
      std::string value = arg.substr(2);
      if (value.empty()) {
        ++i;
        if (i >= args.size()) {
          cmSystemTools::Error("No platform specified for -A");
          return;
        }
        value = args[i];
      }
      if (havePlatform) {
        cmSystemTools::Error("Multiple -A options not allowed");
        return;
      }
      this->SetGeneratorPlatform(value);
      havePlatform = true;
    } else if (arg.find("-T", 0) == 0) {
      std::string value = arg.substr(2);
      if (value.empty()) {
        ++i;
        if (i >= args.size()) {
          cmSystemTools::Error("No toolset specified for -T");
          return;
        }
        value = args[i];
      }
      if (haveToolset) {
        cmSystemTools::Error("Multiple -T options not allowed");
        return;
      }
      this->SetGeneratorToolset(value);
      haveToolset = true;
    } else if (arg.find("-G", 0) == 0) {
      std::string value = arg.substr(2);
      if (value.empty()) {
        ++i;
        if (i >= args.size()) {
          cmSystemTools::Error("No generator specified for -G");
          this->PrintGeneratorList();
          return;
        }
        value = args[i];
      }
      cmGlobalGenerator* gen = this->CreateGlobalGenerator(value);
      if (!gen) {
        std::string kdevError;
        if (value.find("KDevelop3", 0) != std::string::npos) {
          kdevError = "\nThe KDevelop3 generator is not supported anymore.";
        }

        cmSystemTools::Error("Could not create named generator " + value +
                             kdevError);
        this->PrintGeneratorList();
        return;
      }
      this->SetGlobalGenerator(gen);
    }
    // no option assume it is the path to the source or an existing build
    else {
      this->SetDirectoriesFromFile(arg);
    }
    // Empty instance, platform and toolset if only a generator is specified
    if (this->GlobalGenerator) {
      this->GeneratorInstance = "";
      if (!this->GeneratorPlatformSet) {
        this->GeneratorPlatform = "";
      }
      if (!this->GeneratorToolsetSet) {
        this->GeneratorToolset = "";
      }
    }
  }